

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(void)

{
  float *this;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ImU32 col;
  ostream *poVar5;
  GLubyte *pGVar6;
  ImGuiIO *pIVar7;
  ImDrawList *this_00;
  size_t index;
  bool *pbVar8;
  ImDrawData *draw_data;
  float2 vec;
  ImVec2 local_118;
  float2 local_110;
  ImVec2 local_108;
  float2 local_100;
  undefined1 local_f8 [8];
  ImColor color;
  rectf box;
  size_t i_1;
  Iterator __end2;
  Iterator __begin2;
  IndexRange *__range2;
  ImDrawList *draw_list;
  bool z_is_down;
  rectf local_90;
  size_t local_80;
  size_t i;
  Iterator __end4;
  Iterator __begin4;
  IndexRange *__range4;
  float2 fStack_48;
  bool imgui_uses_mouse;
  float2 mouse_position;
  double mouse_y;
  double mouse_x;
  float2 local_24;
  byte local_19;
  GLFWwindow *pGStack_18;
  bool z_was_down;
  GLFWwindow *window;
  
  window._4_4_ = 0;
  iVar4 = glfwInit();
  if (iVar4 == 0) {
    window._4_4_ = 1;
  }
  else {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    pGStack_18 = glfwCreateWindow(0x280,0x1e0,"My Title",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (pGStack_18 == (GLFWwindow *)0x0) {
      window._4_4_ = 1;
    }
    else {
      glfwMakeContextCurrent(pGStack_18);
      glfwSwapInterval(1);
      gladLoadGLLoader(glfwGetProcAddress);
      poVar5 = std::operator<<((ostream *)&std::cout,"OpenGL: ");
      pGVar6 = (*glad_glGetString)(0x1f02);
      poVar5 = std::operator<<(poVar5,pGVar6);
      std::operator<<(poVar5,"\n");
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      ImGui_ImplGlfw_InitForOpenGL(pGStack_18,true);
      ImGui_ImplOpenGL3_Init((char *)0x0);
      local_19 = 0;
      float2::float2(&local_24,100.0,100.0);
      State::add_box(&state,local_24);
      float2::float2((float2 *)((long)&mouse_x + 4),400.0,200.0);
      State::add_box(&state,stack0xffffffffffffffd4);
      push_undo_step();
      while (iVar4 = glfwWindowShouldClose(pGStack_18), iVar4 == 0) {
        glfwPollEvents();
        glfwGetCursorPos(pGStack_18,&mouse_y,(double *)&mouse_position);
        float2::float2(&stack0xffffffffffffffb8,(float)mouse_y,(float)(double)mouse_position);
        pIVar7 = ImGui::GetIO();
        bVar1 = pIVar7->WantCaptureMouse & 1;
        if ((bVar1 == 0) && (iVar4 = glfwGetMouseButton(pGStack_18,0), iVar4 == 1)) {
          ___begin4 = bas::Vector<float2,_4UL,_bas::RawAllocator>::index_range(&state.box_positions)
          ;
          __end4 = bas::IndexRange::begin((IndexRange *)&__begin4);
          i = (size_t)bas::IndexRange::end((IndexRange *)&__begin4);
          while (bVar2 = bas::IndexRange::Iterator::operator!=(&__end4,(Iterator *)&i), bVar2) {
            local_80 = bas::IndexRange::Iterator::operator*(&__end4);
            local_90 = State::get_box_rect(&state,local_80);
            bVar2 = rectf::contains(&local_90,fStack_48);
            if (bVar2) {
              pbVar8 = bas::Vector<bool,_4UL,_bas::RawAllocator>::operator[]
                                 (&state.box_selections,local_80);
              *pbVar8 = true;
            }
            bas::IndexRange::Iterator::operator++(&__end4);
          }
        }
        bVar2 = is_key_down(pGStack_18,0x5a);
        bVar3 = is_key_down(pGStack_18,0x155);
        if (((bVar3) && ((local_19 & 1) == 0)) && (bVar2)) {
          pop_undo_step();
        }
        ImGui_ImplOpenGL3_NewFrame();
        ImGui_ImplGlfw_NewFrame();
        ImGui::NewFrame();
        this_00 = ImGui::GetBackgroundDrawList();
        ___begin2 = bas::Vector<float2,_4UL,_bas::RawAllocator>::index_range(&state.box_positions);
        __end2 = bas::IndexRange::begin((IndexRange *)&__begin2);
        i_1 = (size_t)bas::IndexRange::end((IndexRange *)&__begin2);
        while (bVar3 = bas::IndexRange::Iterator::operator!=(&__end2,(Iterator *)&i_1), bVar3) {
          index = bas::IndexRange::Iterator::operator*(&__end2);
          join_0x00001240_0x00001200_ = State::get_box_rect(&state,index);
          ImColor::ImColor((ImColor *)local_f8,0xe6,0x50,0x50,0xff);
          pbVar8 = bas::Vector<bool,_4UL,_bas::RawAllocator>::operator[]
                             (&state.box_selections,index);
          if ((*pbVar8 & 1U) != 0) {
            local_f8._0_4_ = (float)local_f8._0_4_ * 0.6;
          }
          if (bVar1 == 0) {
            local_100 = fStack_48;
            bVar3 = rectf::contains((rectf *)&color.Value.z,fStack_48);
            if (bVar3) {
              local_f8._0_4_ = (float)local_f8._0_4_ * 0.8;
            }
          }
          this = &color.Value.z;
          local_110 = rectf::upper_left((rectf *)this);
          local_108 = to_im(local_110);
          vec = rectf::lower_right((rectf *)this);
          local_118 = to_im(vec);
          col = ImColor::operator_cast_to_unsigned_int((ImColor *)local_f8);
          ImDrawList::AddRectFilled(this_00,&local_108,&local_118,col,0.0,0xf);
          bas::IndexRange::Iterator::operator++(&__end2);
        }
        ImGui::Begin("Other Window",(bool *)0x0,0);
        ImGui::SliderInt("A",&state.a,0,100,"%d");
        push_undo_after_edit();
        ImGui::End();
        ImGui::Render();
        (*glad_glClear)(0x4100);
        draw_data = ImGui::GetDrawData();
        ImGui_ImplOpenGL3_RenderDrawData(draw_data);
        glfwSwapBuffers(pGStack_18);
        local_19 = bVar2;
      }
      ImGui_ImplGlfw_Shutdown();
      glfwDestroyWindow(pGStack_18);
      glfwTerminate();
      window._4_4_ = 0;
    }
  }
  return window._4_4_;
}

Assistant:

int main()
{
    if (!glfwInit()) {
        return 1;
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

    GLFWwindow *window = glfwCreateWindow(
        640, 480, "My Title", nullptr, nullptr);
    if (window == nullptr) {
        return 1;
    }
    glfwMakeContextCurrent(window);
    glfwSwapInterval(1);

    gladLoadGLLoader((GLADloadproc)glfwGetProcAddress);
    std::cout << "OpenGL: " << glGetString(GL_VERSION) << "\n";

    ImGui::CreateContext();
    ImGui::StyleColorsDark();
    ImGui_ImplGlfw_InitForOpenGL(window, true);
    ImGui_ImplOpenGL3_Init(nullptr);

    bool z_was_down = false;

    // double last_mouse_x = 0.0f;
    // double last_mouse_y = 0.0f;

    state.add_box({100, 100});
    state.add_box({400, 200});
    push_undo_step();

    while (!glfwWindowShouldClose(window)) {
        glfwPollEvents();

        double mouse_x, mouse_y;
        glfwGetCursorPos(window, &mouse_x, &mouse_y);
        float2 mouse_position = {(float)mouse_x, (float)mouse_y};

        bool imgui_uses_mouse = ImGui::GetIO().WantCaptureMouse;

        if (!imgui_uses_mouse) {
            if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT) ==
                GLFW_PRESS) {
                for (size_t i : state.box_positions.index_range()) {
                    if (state.get_box_rect(i).contains(mouse_position)) {
                        state.box_selections[i] = true;
                    }
                }
            }
        }

        bool z_is_down = is_key_down(window, GLFW_KEY_Z);

        if (is_key_down(window, GLFW_KEY_LEFT_CONTROL) && !z_was_down &&
            z_is_down) {
            pop_undo_step();
        }

        ImGui_ImplOpenGL3_NewFrame();
        ImGui_ImplGlfw_NewFrame();

        ImGui::NewFrame();

        {
            ImDrawList *draw_list = ImGui::GetBackgroundDrawList();
            for (size_t i : state.box_positions.index_range()) {
                rectf box = state.get_box_rect(i);
                ImColor color = ImColor(230, 80, 80);
                if (state.box_selections[i]) {
                    color.Value.x *= 0.6f;
                }
                if (!imgui_uses_mouse && box.contains(mouse_position)) {
                    color.Value.x *= 0.8f;
                }

                draw_list->AddRectFilled(
                    to_im(box.upper_left()), to_im(box.lower_right()), color);
            }
        }

        // ImGui::SetNextWindowPos({0, 0});
        // int width, height;
        // glfwGetWindowSize(window, &width, &height);
        // ImGui::SetNextWindowSize({(float)width, (float)height});
        // ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 0.0f);

        // ImGui::Begin("My Window",
        //              nullptr,
        //              ImGuiWindowFlags_NoDecoration |
        //                  ImGuiWindowFlags_NoBringToFrontOnFocus |
        //                  ImGuiWindowFlags_NoInputs);

        // // rect_pos_x = mouse_x;
        // ImDrawList *draw_list = ImGui::GetWindowDrawList();
        // if (!ImGui::GetIO().WantCaptureMouse &&
        //     glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT) ==
        //     GLFW_PRESS) { BAS_UNUSED_VAR(last_mouse_y); rect_pos_x +=
        //     mouse_x - last_mouse_x;
        // }

        // draw_list->AddRectFilled({rect_pos_x, 10},
        //                          {rect_pos_x + 100, 200},
        //                          ImColor(0.8f, 0.8f, 0.3f));
        // const char *text = "Hello World";
        // draw_list->AddText({rect_pos_x, 100}, IM_COL32_WHITE, text, text +
        // 8);

        // ImDrawList *foreground_list = ImGui::GetForegroundDrawList();
        // foreground_list->AddLine({0, 0}, {300, 300}, ImColor(255, 0, 0), 4);

        // ImGui::End();

        // ImGui::PopStyleVar();

        ImGui::Begin("Other Window");
        ImGui::SliderInt("A", &state.a, 0, 100);
        push_undo_after_edit();
        ImGui::End();

        ImGui::Render();

        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData());
        glfwSwapBuffers(window);

        z_was_down = z_is_down;
        // last_mouse_x = mouse_x;
        // last_mouse_y = mouse_y;
    }

    ImGui_ImplGlfw_Shutdown();
    glfwDestroyWindow(window);
    glfwTerminate();

    return 0;
}